

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void UncolorAtomicMergeSet(VmInstruction *inst)

{
  uint uVar1;
  VmInstruction *pVVar2;
  uint uVar3;
  ulong uVar4;
  
  inst->color = 0;
  if (inst->cmd == VM_INST_PHI) {
    uVar1 = (inst->arguments).count;
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        pVVar2 = (VmInstruction *)(inst->arguments).data[uVar4];
        if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
          pVVar2 = (VmInstruction *)0x0;
        }
        if (pVVar2->color != 0) {
          UncolorAtomicMergeSet(pVVar2);
          uVar1 = (inst->arguments).count;
        }
        uVar3 = (int)uVar4 + 2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < uVar1);
    }
  }
  uVar1 = (inst->super_VmValue).users.count;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      pVVar2 = (VmInstruction *)(inst->super_VmValue).users.data[uVar4];
      if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
        pVVar2 = (VmInstruction *)0x0;
      }
      if (pVVar2->cmd == VM_INST_PHI) {
        UncolorAtomicMergeSet(pVVar2);
        uVar1 = (inst->super_VmValue).users.count;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar1);
  }
  return;
}

Assistant:

void UncolorAtomicMergeSet(VmInstruction *inst)
{
	inst->color = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			if(instruction->color != 0)
				UncolorAtomicMergeSet(instruction);
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			UncolorAtomicMergeSet(instruction);
	}
}